

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v11::detail::bigint::remove_leading_zeros(bigint *this)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar5 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
  lVar4 = (long)(int)uVar5;
  uVar3 = 1;
  if ((int)uVar5 < 1) {
    uVar3 = uVar5;
  }
  uVar5 = uVar5 + 1;
  do {
    uVar6 = uVar3;
    if (lVar4 < 2) break;
    uVar5 = uVar5 - 1;
    lVar1 = lVar4 + -1;
    lVar4 = lVar4 + -1;
    uVar6 = uVar5;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[lVar1] == 0);
  uVar7 = (ulong)uVar6;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar7) {
    (*(this->bigits_).super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)this,uVar7);
  }
  uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar7 < uVar2) {
    uVar2 = uVar7;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar2;
  return;
}

Assistant:

FMT_CONSTEXPR void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }